

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_node.cpp
# Opt level: O2

void tst_node_cast(void)

{
  uint __line;
  bool bVar1;
  ostream *poVar2;
  char *__assertion;
  
  bVar1 = tst_node_cast_helper<rengine::OpacityNode>();
  if (!bVar1) {
    bVar1 = tst_node_cast_helper<rengine::OpacityNode>();
    if (!bVar1) {
      __assertion = "tst_node_cast_helper<OpacityNode>()";
      __line = 0x26;
      goto LAB_0010cc36;
    }
  }
  bVar1 = tst_node_cast_helper<rengine::TextureNode>();
  if (!bVar1) {
    bVar1 = tst_node_cast_helper<rengine::TextureNode>();
    if (!bVar1) {
      __assertion = "tst_node_cast_helper<TextureNode>()";
      __line = 0x27;
      goto LAB_0010cc36;
    }
  }
  bVar1 = tst_node_cast_helper<rengine::TransformNode>();
  if (!bVar1) {
    bVar1 = tst_node_cast_helper<rengine::TransformNode>();
    if (!bVar1) {
      __assertion = "tst_node_cast_helper<TransformNode>()";
      __line = 0x28;
      goto LAB_0010cc36;
    }
  }
  bVar1 = tst_node_cast_helper<rengine::RectangleNode>();
  if (!bVar1) {
    bVar1 = tst_node_cast_helper<rengine::RectangleNode>();
    if (!bVar1) {
      __assertion = "tst_node_cast_helper<RectangleNode>()";
      __line = 0x29;
      goto LAB_0010cc36;
    }
  }
  bVar1 = tst_node_cast_helper<rengine::ColorFilterNode>();
  if (!bVar1) {
    bVar1 = tst_node_cast_helper<rengine::ColorFilterNode>();
    if (!bVar1) {
      __assertion = "tst_node_cast_helper<ColorFilterNode>()";
      __line = 0x2a;
      goto LAB_0010cc36;
    }
  }
  bVar1 = tst_node_cast_helper<rengine::BlurNode>();
  if (!bVar1) {
    bVar1 = tst_node_cast_helper<rengine::BlurNode>();
    if (!bVar1) {
      __assertion = "tst_node_cast_helper<BlurNode>()";
      __line = 0x2b;
      goto LAB_0010cc36;
    }
  }
  bVar1 = tst_node_cast_helper<rengine::ShadowNode>();
  if (!bVar1) {
    bVar1 = tst_node_cast_helper<rengine::ShadowNode>();
    if (!bVar1) {
      __assertion = "tst_node_cast_helper<ShadowNode>()";
      __line = 0x2c;
LAB_0010cc36:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_node.cpp"
                    ,__line,"void tst_node_cast()");
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"tst_node_cast");
  poVar2 = std::operator<<(poVar2,": ok");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void tst_node_cast()
{
    check_true(tst_node_cast_helper<OpacityNode>());
    check_true(tst_node_cast_helper<TextureNode>());
    check_true(tst_node_cast_helper<TransformNode>());
    check_true(tst_node_cast_helper<RectangleNode>());
    check_true(tst_node_cast_helper<ColorFilterNode>());
    check_true(tst_node_cast_helper<BlurNode>());
    check_true(tst_node_cast_helper<ShadowNode>());

    cout << __FUNCTION__ << ": ok" << endl;
}